

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

void Bmcg_ManAddCnf(Bmcg_Man_t *p,bmcg_sat_solver *pSat,Cnf_Dat_t *pCnf)

{
  uint uVar1;
  int *plits;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  bmcg_sat_solver_set_nvars(pSat,p->nSatVars);
  if (p->pPars->fUseEliminate != 0) {
    uVar1 = p->nOldFrPis;
    uVar7 = (ulong)uVar1;
    pGVar4 = p->pFrames;
    iVar2 = pGVar4->nRegs;
    pVVar6 = pGVar4->vCis;
    iVar3 = pVVar6->nSize;
    if ((int)uVar1 < iVar3 - iVar2) {
      do {
        if (((int)uVar1 < 0) || (iVar3 <= (int)uVar7)) goto LAB_0057514d;
        iVar2 = pVVar6->pArray[uVar7];
        if (((long)iVar2 < 0) || (pGVar4->nObjs <= iVar2)) goto LAB_0057516c;
        if ((p->vFr2Sat).nSize <= iVar2) goto LAB_0057514d;
        iVar2 = (p->vFr2Sat).pArray[iVar2];
        if (0 < iVar2) {
          bmcg_sat_solver_var_set_frozen(pSat,iVar2,1);
          pGVar4 = p->pFrames;
        }
        uVar7 = uVar7 + 1;
        iVar2 = pGVar4->nRegs;
        pVVar6 = pGVar4->vCis;
        iVar3 = pVVar6->nSize;
      } while ((int)uVar7 < iVar3 - iVar2);
    }
    uVar1 = p->nOldFrPos;
    uVar7 = (ulong)uVar1;
    pVVar6 = pGVar4->vCos;
    iVar3 = pVVar6->nSize;
    iVar8 = iVar3 - iVar2;
    if ((int)uVar1 < iVar8) {
      do {
        if (((int)uVar1 < 0) || (iVar3 <= (int)uVar7)) {
LAB_0057514d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar6->pArray[uVar7];
        if (((long)iVar2 < 0) || (pGVar4->nObjs <= iVar2)) {
LAB_0057516c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((p->vFr2Sat).nSize <= iVar2) goto LAB_0057514d;
        iVar2 = (p->vFr2Sat).pArray[iVar2];
        if (0 < iVar2) {
          bmcg_sat_solver_var_set_frozen(pSat,iVar2,1);
          pGVar4 = p->pFrames;
        }
        uVar7 = uVar7 + 1;
        iVar2 = pGVar4->nRegs;
        pVVar6 = pGVar4->vCos;
        iVar3 = pVVar6->nSize;
        iVar8 = iVar3 - iVar2;
      } while ((int)uVar7 < iVar8);
    }
    p->nOldFrPis = pGVar4->vCis->nSize - iVar2;
    p->nOldFrPos = iVar8;
  }
  lVar9 = 0;
  do {
    if (pCnf->nClauses <= lVar9) {
      if (p->pPars->fUseEliminate != 0) {
        bmcg_sat_solver_eliminate(pSat,0);
        iVar2 = (p->vFr2Sat).nSize;
        if (0 < iVar2) {
          lVar9 = 0;
          do {
            iVar3 = (p->vFr2Sat).pArray[lVar9];
            if (0 < iVar3) {
              iVar3 = bmcg_sat_solver_var_is_elim(pSat,iVar3);
              iVar2 = (p->vFr2Sat).nSize;
              if (iVar3 != 0) {
                if (iVar2 <= lVar9) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                (p->vFr2Sat).pArray[lVar9] = -1;
                iVar2 = (p->vFr2Sat).nSize;
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < iVar2);
        }
        iVar2 = clock_gettime(3,&local_40);
        if (iVar2 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeSmp = p->timeSmp + lVar9 + lVar5;
      }
      return;
    }
    plits = pCnf->pClauses[lVar9];
    iVar2 = bmcg_sat_solver_addclause
                      (pSat,plits,(int)((ulong)((long)pCnf->pClauses[lVar9 + 1] - (long)plits) >> 2)
                      );
    lVar9 = lVar9 + 1;
  } while (iVar2 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                ,0x15c,"void Bmcg_ManAddCnf(Bmcg_Man_t *, bmcg_sat_solver *, Cnf_Dat_t *)");
}

Assistant:

void Bmcg_ManAddCnf( Bmcg_Man_t * p, bmcg_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i, iSatVar;
    abctime clk = Abc_Clock();
    bmcg_sat_solver_set_nvars( pSat, p->nSatVars );
    if ( p->pPars->fUseEliminate )
    {
        for ( i = p->nOldFrPis; i < Gia_ManPiNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPi( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        for ( i = p->nOldFrPos; i < Gia_ManPoNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPo( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        p->nOldFrPis = Gia_ManPiNum(p->pFrames);
        p->nOldFrPos = Gia_ManPoNum(p->pFrames);
    }
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmcg_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    if ( !p->pPars->fUseEliminate )
        return;
    bmcg_sat_solver_eliminate( pSat, 0 );
    Vec_IntForEachEntry( &p->vFr2Sat, iSatVar, i )
        if ( iSatVar > 0 && bmcg_sat_solver_var_is_elim(pSat, iSatVar) )
            Vec_IntWriteEntry( &p->vFr2Sat, i, -1 );
    p->timeSmp += Abc_Clock() - clk;
}